

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O0

size_type __thiscall
lf::assemble::DynamicFEDofHandler::NumLocalDofs(DynamicFEDofHandler *this,Entity *entity)

{
  value_type vVar1;
  int iVar2;
  dim_t dVar3;
  uint uVar4;
  element_type *peVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  glb_idx_t entity_index;
  dim_t codim;
  RefEl ref_el_type;
  Entity *entity_local;
  DynamicFEDofHandler *this_local;
  
  _codim = entity;
  iVar2 = (*entity->_vptr_Entity[4])();
  entity_index._3_1_ = (undefined1)iVar2;
  dVar3 = lf::base::RefEl::Dimension((RefEl *)((long)&entity_index + 3));
  peVar5 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_p_);
  uVar4 = (*peVar5->_vptr_Mesh[5])(peVar5,_codim);
  pvVar6 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::operator[]
                     (&this->offsets_,(ulong)(2 - dVar3));
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (pvVar6,(ulong)(uVar4 + 1));
  vVar1 = *pvVar7;
  pvVar6 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::operator[]
                     (&this->offsets_,(ulong)(2 - dVar3));
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar6,(ulong)uVar4)
  ;
  return vVar1 - *pvVar7;
}

Assistant:

size_type DynamicFEDofHandler::NumLocalDofs(
    const lf::mesh::Entity &entity) const {
  const lf::base::RefEl ref_el_type = entity.RefEl();
  const dim_t codim = 2 - ref_el_type.Dimension();
  const glb_idx_t entity_index = mesh_p_->Index(entity);
  return (offsets_[codim][entity_index + 1] - offsets_[codim][entity_index]);
}